

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_double_fast.c
# Opt level: O3

size_t ZSTD_compressBlock_doubleFast_extDict_generic
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize,
                 U32 mls)

{
  BYTE *iEnd;
  long *iStart;
  long *plVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  U32 *pUVar5;
  U32 *pUVar6;
  BYTE *pBVar7;
  BYTE *pBVar8;
  uint uVar9;
  BYTE *op;
  size_t sVar10;
  long lVar11;
  byte bVar12;
  byte bVar13;
  U32 UVar14;
  uint uVar15;
  U32 UVar16;
  BYTE *pBVar17;
  long *plVar18;
  long *plVar19;
  ulong uVar20;
  BYTE *pBVar21;
  uint uVar22;
  U32 UVar23;
  U32 UVar24;
  long *plVar25;
  BYTE *pBVar26;
  long *plVar27;
  seqDef *psVar28;
  BYTE *ip;
  ulong uVar29;
  BYTE *pBVar30;
  uint uVar31;
  ulong uVar33;
  long *plVar34;
  long *plVar35;
  U32 local_a4;
  ulong uVar32;
  
  iEnd = (BYTE *)((long)src + srcSize);
  plVar1 = (long *)((long)src + (srcSize - 8));
  UVar23 = *rep;
  local_a4 = rep[1];
  if (src < plVar1) {
    pUVar5 = ms->hashTable;
    pUVar6 = ms->chainTable;
    uVar2 = (ms->window).dictLimit;
    pBVar7 = (ms->window).base;
    pBVar8 = (ms->window).dictBase;
    iStart = (long *)(pBVar7 + uVar2);
    uVar3 = (ms->window).lowLimit;
    plVar25 = (long *)(pBVar8 + uVar3);
    pBVar26 = pBVar8 + uVar2;
    bVar12 = 0x20 - (char)(ms->cParams).chainLog;
    bVar13 = 0x40 - (char)(ms->cParams).hashLog;
    uVar31 = mls - 5;
    uVar32 = (ulong)uVar31;
    plVar35 = (long *)src;
    do {
      if (uVar31 < 4) {
        sVar10 = (*(code *)(&DAT_0058e674 + *(int *)(&DAT_0058e674 + uVar32 * 4)))();
        return sVar10;
      }
      uVar22 = (uint)((int)*plVar35 * -0x61c8864f) >> (bVar12 & 0x1f);
      lVar11 = *plVar35;
      uVar9 = pUVar6[uVar22];
      pBVar17 = pBVar7;
      if (uVar9 < uVar2) {
        pBVar17 = pBVar8;
      }
      uVar29 = (ulong)(lVar11 * -0x30e44323485a9b9d) >> (bVar13 & 0x3f);
      uVar4 = pUVar5[uVar29];
      pBVar21 = pBVar7;
      if (uVar4 < uVar2) {
        pBVar21 = pBVar8;
      }
      uVar33 = (long)plVar35 - (long)pBVar7;
      UVar24 = (U32)uVar33;
      UVar14 = UVar24 + 1;
      uVar15 = UVar14 - UVar23;
      pUVar5[uVar29] = UVar24;
      pBVar30 = pBVar7;
      if (uVar15 < uVar2) {
        pBVar30 = pBVar8;
      }
      pUVar6[uVar22] = UVar24;
      if ((uVar3 < uVar15 && 2 < (uVar2 - 1) - uVar15) &&
         (*(int *)(pBVar30 + uVar15) == *(int *)((long)plVar35 + 1))) {
        plVar34 = (long *)((long)plVar35 + 1);
        pBVar17 = iEnd;
        if (uVar15 < uVar2) {
          pBVar17 = pBVar26;
        }
        sVar10 = ZSTD_count_2segments
                           ((BYTE *)((long)plVar35 + 5),(BYTE *)((long)(pBVar30 + uVar15) + 4),iEnd,
                            pBVar17,(BYTE *)iStart);
        uVar29 = (long)plVar34 - (long)src;
        plVar27 = (long *)seqStore->lit;
        plVar35 = (long *)((long)plVar27 + uVar29);
        do {
          *plVar27 = *src;
          plVar27 = plVar27 + 1;
          src = (void *)((long)src + 8);
        } while (plVar27 < plVar35);
        seqStore->lit = seqStore->lit + uVar29;
        if (uVar29 < 0x10000) {
          psVar28 = seqStore->sequences;
        }
        else {
          seqStore->longLengthID = 1;
          psVar28 = seqStore->sequences;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar28 - (long)seqStore->sequencesStart) >> 3);
        }
        lVar11 = sVar10 + 4;
        uVar20 = sVar10 + 1;
        psVar28->litLength = (U16)uVar29;
        psVar28->offset = 1;
        UVar14 = UVar23;
joined_r0x0047e30f:
        if (0xffff < uVar20) {
          seqStore->longLengthID = 2;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar28 - (long)seqStore->sequencesStart) >> 3);
        }
        src = (void *)(lVar11 + (long)plVar34);
        psVar28->matchLength = (U16)uVar20;
        seqStore->sequences = psVar28 + 1;
        plVar35 = (long *)src;
        UVar23 = UVar14;
        if (src <= plVar1) {
          uVar33 = uVar33 & 0xffffffff;
          if (uVar31 < 4) {
            sVar10 = (*(code *)(&DAT_0058e684 + *(int *)(&DAT_0058e684 + uVar32 * 4)))();
            return sVar10;
          }
          pUVar6[(uint)(*(int *)(pBVar7 + uVar33 + 2) * -0x61c8864f) >> (bVar12 & 0x1f)] =
               UVar24 + 2;
          pUVar5[(ulong)(*(long *)(pBVar7 + uVar33 + 2) * -0x30e44323485a9b9d) >> (bVar13 & 0x3f)] =
               UVar24 + 2;
          lVar11 = *(long *)((long)src + -2);
          UVar23 = ((int)src + -2) - (int)pBVar7;
          pUVar6[(uint)(*(int *)((long)src + -2) * -0x61c8864f) >> (bVar12 & 0x1f)] = UVar23;
          pUVar5[(ulong)(lVar11 * -0x30e44323485a9b9d) >> (bVar13 & 0x3f)] = UVar23;
          UVar24 = local_a4;
          do {
            UVar16 = UVar14;
            UVar14 = (int)src - (int)pBVar7;
            uVar9 = UVar14 - UVar24;
            pBVar17 = pBVar7;
            if (uVar9 < uVar2) {
              pBVar17 = pBVar8;
            }
            plVar35 = (long *)src;
            local_a4 = UVar24;
            UVar23 = UVar16;
            if (((uVar9 <= uVar3) || ((uVar2 - 1) - uVar9 < 3)) ||
               (*(int *)(pBVar17 + uVar9) != (int)*src)) break;
            pBVar21 = iEnd;
            if (uVar9 < uVar2) {
              pBVar21 = pBVar26;
            }
            sVar10 = ZSTD_count_2segments
                               ((BYTE *)((long)src + 4),(BYTE *)((long)(pBVar17 + uVar9) + 4),iEnd,
                                pBVar21,(BYTE *)iStart);
            *(long *)seqStore->lit = *src;
            psVar28 = seqStore->sequences;
            psVar28->litLength = 0;
            psVar28->offset = 1;
            if (0xffff < sVar10 + 1) {
              seqStore->longLengthID = 2;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar28 - (long)seqStore->sequencesStart) >> 3);
            }
            psVar28->matchLength = (U16)(sVar10 + 1);
            seqStore->sequences = psVar28 + 1;
            if (uVar31 < 4) {
              sVar10 = (*(code *)(&DAT_0058e694 + *(int *)(&DAT_0058e694 + uVar32 * 4)))(pBVar7);
              return sVar10;
            }
            lVar11 = *src;
            pUVar6[(uint)((int)*src * -0x61c8864f) >> (bVar12 & 0x1f)] = UVar14;
            pUVar5[(ulong)(lVar11 * -0x30e44323485a9b9d) >> (bVar13 & 0x3f)] = UVar14;
            src = (void *)((long)src + sVar10 + 4);
            plVar35 = (long *)src;
            local_a4 = UVar16;
            UVar23 = UVar24;
            UVar14 = UVar24;
            UVar24 = UVar16;
          } while (src <= plVar1);
        }
      }
      else {
        plVar34 = plVar35;
        if ((uVar3 < uVar4) && (plVar27 = (long *)(pBVar21 + uVar4), *plVar27 == lVar11)) {
          plVar19 = iStart;
          pBVar17 = iEnd;
          if (uVar4 < uVar2) {
            plVar19 = plVar25;
            pBVar17 = pBVar26;
          }
          sVar10 = ZSTD_count_2segments
                             ((BYTE *)(plVar35 + 1),(BYTE *)(plVar27 + 1),iEnd,pBVar17,
                              (BYTE *)iStart);
          lVar11 = sVar10 + 8;
          if ((plVar19 < plVar27) && (src < plVar35)) {
            plVar27 = (long *)(pBVar21 + uVar4);
            do {
              plVar27 = (long *)((long)plVar27 + -1);
              plVar18 = (long *)((long)plVar35 - 1);
              plVar34 = plVar35;
              if (((BYTE)*plVar18 != *(BYTE *)plVar27) ||
                 (lVar11 = lVar11 + 1, plVar34 = plVar18, plVar27 <= plVar19)) break;
              plVar35 = plVar18;
            } while (src < plVar18);
          }
          uVar29 = (long)plVar34 - (long)src;
          plVar27 = (long *)seqStore->lit;
          plVar35 = (long *)((long)plVar27 + uVar29);
          do {
            *plVar27 = *src;
            plVar27 = plVar27 + 1;
            src = (void *)((long)src + 8);
          } while (plVar27 < plVar35);
          seqStore->lit = seqStore->lit + uVar29;
          if (uVar29 < 0x10000) {
            psVar28 = seqStore->sequences;
          }
          else {
            seqStore->longLengthID = 1;
            psVar28 = seqStore->sequences;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar28 - (long)seqStore->sequencesStart) >> 3);
          }
          uVar20 = lVar11 - 3;
          psVar28->litLength = (U16)uVar29;
          psVar28->offset = (UVar24 - uVar4) + 3;
          UVar14 = UVar24 - uVar4;
          local_a4 = UVar23;
          goto joined_r0x0047e30f;
        }
        if ((uVar3 < uVar9) && (plVar27 = (long *)(pBVar17 + uVar9), (int)*plVar27 == (int)*plVar35)
           ) {
          lVar11 = *(long *)((long)plVar35 + 1);
          uVar29 = (ulong)(lVar11 * -0x30e44323485a9b9d) >> (bVar13 & 0x3f);
          uVar22 = pUVar5[uVar29];
          pBVar21 = pBVar7;
          if (uVar22 < uVar2) {
            pBVar21 = pBVar8;
          }
          pUVar5[uVar29] = UVar14;
          if ((uVar3 < uVar22) && (plVar19 = (long *)(pBVar21 + uVar22), *plVar19 == lVar11)) {
            plVar34 = (long *)((long)plVar35 + 1);
            plVar27 = iStart;
            pBVar17 = iEnd;
            if (uVar22 < uVar2) {
              plVar27 = plVar25;
              pBVar17 = pBVar26;
            }
            sVar10 = ZSTD_count_2segments
                               ((BYTE *)((long)plVar35 + 9),(BYTE *)(plVar19 + 1),iEnd,pBVar17,
                                (BYTE *)iStart);
            lVar11 = sVar10 + 8;
            UVar14 = UVar14 - uVar22;
            if ((plVar27 < plVar19) && (src < plVar34)) {
              plVar19 = (long *)(pBVar21 + uVar22);
              while (plVar34 = plVar35, plVar19 = (long *)((long)plVar19 + -1),
                    (BYTE)*plVar34 == *(BYTE *)plVar19) {
                lVar11 = lVar11 + 1;
                if ((plVar19 <= plVar27) || (plVar35 = (long *)((long)plVar34 + -1), plVar34 <= src)
                   ) goto LAB_0047e36a;
              }
              plVar34 = (long *)((long)plVar34 + 1);
            }
          }
          else {
            plVar19 = iStart;
            pBVar21 = iEnd;
            if (uVar9 < uVar2) {
              plVar19 = plVar25;
              pBVar21 = pBVar26;
            }
            sVar10 = ZSTD_count_2segments
                               ((BYTE *)((long)plVar35 + 4),(BYTE *)((long)plVar27 + 4),iEnd,pBVar21
                                ,(BYTE *)iStart);
            lVar11 = sVar10 + 4;
            UVar14 = UVar24 - uVar9;
            if ((plVar19 < plVar27) && (src < plVar35)) {
              plVar27 = (long *)(pBVar17 + ((ulong)uVar9 - 1));
              do {
                plVar18 = (long *)((long)plVar35 - 1);
                plVar34 = plVar35;
                if (((BYTE)*plVar18 != (BYTE)*plVar27) ||
                   (lVar11 = lVar11 + 1, plVar34 = plVar18, plVar27 <= plVar19)) break;
                plVar27 = (long *)((long)plVar27 + -1);
                plVar35 = plVar18;
              } while (src < plVar18);
            }
          }
LAB_0047e36a:
          uVar29 = (long)plVar34 - (long)src;
          plVar27 = (long *)seqStore->lit;
          plVar35 = (long *)((long)plVar27 + uVar29);
          do {
            *plVar27 = *src;
            plVar27 = plVar27 + 1;
            src = (void *)((long)src + 8);
          } while (plVar27 < plVar35);
          seqStore->lit = seqStore->lit + uVar29;
          if (uVar29 < 0x10000) {
            psVar28 = seqStore->sequences;
          }
          else {
            seqStore->longLengthID = 1;
            psVar28 = seqStore->sequences;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar28 - (long)seqStore->sequencesStart) >> 3);
          }
          uVar20 = lVar11 - 3;
          psVar28->litLength = (U16)uVar29;
          psVar28->offset = UVar14 + 3;
          local_a4 = UVar23;
          goto joined_r0x0047e30f;
        }
        plVar35 = (long *)((long)plVar35 + ((long)plVar35 - (long)src >> 8) + 1);
      }
    } while (plVar35 < plVar1);
  }
  *rep = UVar23;
  rep[1] = local_a4;
  return (long)iEnd - (long)src;
}

Assistant:

static size_t ZSTD_compressBlock_doubleFast_extDict_generic(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize,
        U32 const mls /* template */)
{
    ZSTD_compressionParameters const* cParams = &ms->cParams;
    U32* const hashLong = ms->hashTable;
    U32  const hBitsL = cParams->hashLog;
    U32* const hashSmall = ms->chainTable;
    U32  const hBitsS = cParams->chainLog;
    const BYTE* const istart = (const BYTE*)src;
    const BYTE* ip = istart;
    const BYTE* anchor = istart;
    const BYTE* const iend = istart + srcSize;
    const BYTE* const ilimit = iend - 8;
    const U32   prefixStartIndex = ms->window.dictLimit;
    const BYTE* const base = ms->window.base;
    const BYTE* const prefixStart = base + prefixStartIndex;
    const U32   dictStartIndex = ms->window.lowLimit;
    const BYTE* const dictBase = ms->window.dictBase;
    const BYTE* const dictStart = dictBase + dictStartIndex;
    const BYTE* const dictEnd = dictBase + prefixStartIndex;
    U32 offset_1=rep[0], offset_2=rep[1];

    DEBUGLOG(5, "ZSTD_compressBlock_doubleFast_extDict_generic (srcSize=%zu)", srcSize);

    /* Search Loop */
    while (ip < ilimit) {  /* < instead of <=, because (ip+1) */
        const size_t hSmall = ZSTD_hashPtr(ip, hBitsS, mls);
        const U32 matchIndex = hashSmall[hSmall];
        const BYTE* const matchBase = matchIndex < prefixStartIndex ? dictBase : base;
        const BYTE* match = matchBase + matchIndex;

        const size_t hLong = ZSTD_hashPtr(ip, hBitsL, 8);
        const U32 matchLongIndex = hashLong[hLong];
        const BYTE* const matchLongBase = matchLongIndex < prefixStartIndex ? dictBase : base;
        const BYTE* matchLong = matchLongBase + matchLongIndex;

        const U32 current = (U32)(ip-base);
        const U32 repIndex = current + 1 - offset_1;   /* offset_1 expected <= current +1 */
        const BYTE* const repBase = repIndex < prefixStartIndex ? dictBase : base;
        const BYTE* const repMatch = repBase + repIndex;
        size_t mLength;
        hashSmall[hSmall] = hashLong[hLong] = current;   /* update hash table */

        if ((((U32)((prefixStartIndex-1) - repIndex) >= 3) /* intentional underflow : ensure repIndex doesn't overlap dict + prefix */
            & (repIndex > dictStartIndex))
          && (MEM_read32(repMatch) == MEM_read32(ip+1)) ) {
            const BYTE* repMatchEnd = repIndex < prefixStartIndex ? dictEnd : iend;
            mLength = ZSTD_count_2segments(ip+1+4, repMatch+4, iend, repMatchEnd, prefixStart) + 4;
            ip++;
            ZSTD_storeSeq(seqStore, ip-anchor, anchor, 0, mLength-MINMATCH);
        } else {
            if ((matchLongIndex > dictStartIndex) && (MEM_read64(matchLong) == MEM_read64(ip))) {
                const BYTE* const matchEnd = matchLongIndex < prefixStartIndex ? dictEnd : iend;
                const BYTE* const lowMatchPtr = matchLongIndex < prefixStartIndex ? dictStart : prefixStart;
                U32 offset;
                mLength = ZSTD_count_2segments(ip+8, matchLong+8, iend, matchEnd, prefixStart) + 8;
                offset = current - matchLongIndex;
                while (((ip>anchor) & (matchLong>lowMatchPtr)) && (ip[-1] == matchLong[-1])) { ip--; matchLong--; mLength++; }   /* catch up */
                offset_2 = offset_1;
                offset_1 = offset;
                ZSTD_storeSeq(seqStore, ip-anchor, anchor, offset + ZSTD_REP_MOVE, mLength-MINMATCH);

            } else if ((matchIndex > dictStartIndex) && (MEM_read32(match) == MEM_read32(ip))) {
                size_t const h3 = ZSTD_hashPtr(ip+1, hBitsL, 8);
                U32 const matchIndex3 = hashLong[h3];
                const BYTE* const match3Base = matchIndex3 < prefixStartIndex ? dictBase : base;
                const BYTE* match3 = match3Base + matchIndex3;
                U32 offset;
                hashLong[h3] = current + 1;
                if ( (matchIndex3 > dictStartIndex) && (MEM_read64(match3) == MEM_read64(ip+1)) ) {
                    const BYTE* const matchEnd = matchIndex3 < prefixStartIndex ? dictEnd : iend;
                    const BYTE* const lowMatchPtr = matchIndex3 < prefixStartIndex ? dictStart : prefixStart;
                    mLength = ZSTD_count_2segments(ip+9, match3+8, iend, matchEnd, prefixStart) + 8;
                    ip++;
                    offset = current+1 - matchIndex3;
                    while (((ip>anchor) & (match3>lowMatchPtr)) && (ip[-1] == match3[-1])) { ip--; match3--; mLength++; } /* catch up */
                } else {
                    const BYTE* const matchEnd = matchIndex < prefixStartIndex ? dictEnd : iend;
                    const BYTE* const lowMatchPtr = matchIndex < prefixStartIndex ? dictStart : prefixStart;
                    mLength = ZSTD_count_2segments(ip+4, match+4, iend, matchEnd, prefixStart) + 4;
                    offset = current - matchIndex;
                    while (((ip>anchor) & (match>lowMatchPtr)) && (ip[-1] == match[-1])) { ip--; match--; mLength++; }   /* catch up */
                }
                offset_2 = offset_1;
                offset_1 = offset;
                ZSTD_storeSeq(seqStore, ip-anchor, anchor, offset + ZSTD_REP_MOVE, mLength-MINMATCH);

            } else {
                ip += ((ip-anchor) >> kSearchStrength) + 1;
                continue;
        }   }

        /* found a match : store it */
        ip += mLength;
        anchor = ip;

        if (ip <= ilimit) {
            /* Fill Table */
            hashSmall[ZSTD_hashPtr(base+current+2, hBitsS, mls)] = current+2;
            hashLong[ZSTD_hashPtr(base+current+2, hBitsL, 8)] = current+2;
            hashSmall[ZSTD_hashPtr(ip-2, hBitsS, mls)] = (U32)(ip-2-base);
            hashLong[ZSTD_hashPtr(ip-2, hBitsL, 8)] = (U32)(ip-2-base);
            /* check immediate repcode */
            while (ip <= ilimit) {
                U32 const current2 = (U32)(ip-base);
                U32 const repIndex2 = current2 - offset_2;
                const BYTE* repMatch2 = repIndex2 < prefixStartIndex ? dictBase + repIndex2 : base + repIndex2;
                if ( (((U32)((prefixStartIndex-1) - repIndex2) >= 3)   /* intentional overflow : ensure repIndex2 doesn't overlap dict + prefix */
                    & (repIndex2 > dictStartIndex))
                  && (MEM_read32(repMatch2) == MEM_read32(ip)) ) {
                    const BYTE* const repEnd2 = repIndex2 < prefixStartIndex ? dictEnd : iend;
                    size_t const repLength2 = ZSTD_count_2segments(ip+4, repMatch2+4, iend, repEnd2, prefixStart) + 4;
                    U32 const tmpOffset = offset_2; offset_2 = offset_1; offset_1 = tmpOffset;   /* swap offset_2 <=> offset_1 */
                    ZSTD_storeSeq(seqStore, 0, anchor, 0, repLength2-MINMATCH);
                    hashSmall[ZSTD_hashPtr(ip, hBitsS, mls)] = current2;
                    hashLong[ZSTD_hashPtr(ip, hBitsL, 8)] = current2;
                    ip += repLength2;
                    anchor = ip;
                    continue;
                }
                break;
    }   }   }

    /* save reps for next block */
    rep[0] = offset_1;
    rep[1] = offset_2;

    /* Return the last literals size */
    return iend - anchor;
}